

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::f_store(Forth *this)

{
  uint uVar1;
  long lVar2;
  double x;
  double local_28;
  
  requireDStackDepth(this,1,"F!");
  requireFStackDepth(this,1,"F!");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  local_28 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  lVar2 = 0;
  do {
    dataSpaceSet(this,uVar1 + (int)lVar2,*(Char *)((long)&local_28 + lVar2));
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return;
}

Assistant:

void f_store() {
			REQUIRE_DSTACK_DEPTH(1, "F!");
			REQUIRE_FSTACK_DEPTH(1, "F!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "F!");
			auto x = fStack.getTop(); fStack.pop();
			setDataCell(aaddr, x);
		}